

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void strdump(char *e,char *p,wchar_t ewidth,wchar_t utf8)

{
  wchar_t wVar1;
  size_t sVar2;
  int in_ECX;
  byte *pbVar3;
  uint in_EDX;
  byte *in_RSI;
  undefined8 in_RDI;
  wchar_t cnt;
  wchar_t n;
  uint32_t uc;
  size_t len;
  uint c;
  char *q;
  uint local_4c;
  uint local_3c;
  uint local_34;
  size_t local_30;
  uint local_24;
  byte *local_20;
  int local_18;
  byte *local_10;
  
  local_20 = in_RSI;
  local_18 = in_ECX;
  local_10 = in_RSI;
  logprintf("      %*s = ",(ulong)in_EDX,in_RDI);
  if (local_10 == (byte *)0x0) {
    logprintf("NULL\n");
  }
  else {
    logprintf("\"");
    while (*local_10 != 0) {
      pbVar3 = local_10 + 1;
      local_24 = (uint)*local_10;
      local_10 = pbVar3;
      switch(local_24) {
      case 7:
        printf("\a");
        break;
      case 8:
        printf("\b");
        break;
      default:
        if ((local_24 < 0x20) || (0x7e < local_24)) {
          logprintf("\\x%02X",(ulong)local_24);
        }
        else {
          logprintf("%c",(ulong)local_24);
        }
        break;
      case 10:
        printf("\n");
        break;
      case 0xd:
        printf("\r");
      }
    }
    logprintf("\"");
    if (local_20 == (byte *)0x0) {
      local_4c = 0xffffffff;
    }
    else {
      sVar2 = strlen((char *)local_20);
      local_4c = (uint)sVar2;
    }
    logprintf(" (length %d)",(ulong)local_4c);
    if (local_18 != 0) {
      local_3c = 0;
      local_10 = local_20;
      local_30 = strlen((char *)local_20);
      logprintf(" [");
      while (wVar1 = _utf8_to_unicode(&local_34,(char *)local_10,local_30), L'\0' < wVar1) {
        if (local_10 != local_20) {
          logprintf(" ");
        }
        logprintf("%04X",(ulong)local_34);
        local_10 = local_10 + wVar1;
        local_30 = local_30 - (long)wVar1;
        local_3c = local_3c + 1;
      }
      logprintf("]");
      logprintf(" (count %d",(ulong)local_3c);
      if (wVar1 < L'\0') {
        logprintf(",unknown %d bytes",local_30);
      }
      logprintf(")");
    }
    logprintf("\n");
  }
  return;
}

Assistant:

static void strdump(const char *e, const char *p, int ewidth, int utf8)
{
	const char *q = p;

	logprintf("      %*s = ", ewidth, e);
	if (p == NULL) {
		logprintf("NULL\n");
		return;
	}
	logprintf("\"");
	while (*p != '\0') {
		unsigned int c = 0xff & *p++;
		switch (c) {
		case '\a': printf("\a"); break;
		case '\b': printf("\b"); break;
		case '\n': printf("\n"); break;
		case '\r': printf("\r"); break;
		default:
			if (c >= 32 && c < 127)
				logprintf("%c", c);
			else
				logprintf("\\x%02X", c);
		}
	}
	logprintf("\"");
	logprintf(" (length %d)", q == NULL ? -1 : (int)strlen(q));

	/*
	 * If the current string is UTF-8, dump its code points.
	 */
	if (utf8) {
		size_t len;
		uint32_t uc;
		int n;
		int cnt = 0;

		p = q;
		len = strlen(p);
		logprintf(" [");
		while ((n = _utf8_to_unicode(&uc, p, len)) > 0) {
			if (p != q)
				logprintf(" ");
			logprintf("%04X", uc);
			p += n;
			len -= n;
			cnt++;
		}
		logprintf("]");
		logprintf(" (count %d", cnt);
		if (n < 0) {
			logprintf(",unknown %d bytes", len);
		}
		logprintf(")");

	}
	logprintf("\n");
}